

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

void __thiscall
GrcSymbolTableEntry::CreateFeatAltIDSymbol
          (GrcSymbolTableEntry *this,GrcSymbolTable *psymtbl,GdlFeatureDefn *pfeat,
          GdlStringExpression *pexpString)

{
  pointer pcVar1;
  Symbol pGVar2;
  string staNewSymbol;
  string staValue;
  GrpLineAndFile lnf;
  undefined1 local_d0 [32];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  GrpLineAndFile local_50;
  
  pcVar1 = (pexpString->m_staValue)._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + (pexpString->m_staValue)._M_string_length);
  GrpLineAndFile::GrpLineAndFile
            (&local_50,
             &(pexpString->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject.m_lnf);
  local_a8 = 0;
  local_a0 = 0;
  pcVar1 = (pfeat->m_staName)._M_dataplus._M_p;
  local_d0._0_8_ = (pointer)(local_d0 + 0x10);
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + (pfeat->m_staName)._M_string_length);
  std::__cxx11::string::_M_append((char *)&local_b0,local_d0._0_8_);
  if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d0._16_8_)->_M_p + 1));
  }
  std::__cxx11::string::append((char *)&local_b0);
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90[0]);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b0,local_b0 + local_a8);
  GrcStructName::GrcStructName((GrcStructName *)local_d0,&local_70);
  pGVar2 = GrcSymbolTable::AddSymbolAux
                     (psymtbl,(GrcStructName *)local_d0,ksymtFeature,ksymtInvalid,&local_50);
  pGVar2->m_pData = &pfeat->super_GdlDefn;
  pGVar2->m_fHasData = true;
  pGVar2->m_expt = kexptNumber;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_staFile._M_dataplus._M_p != &local_50.m_staFile.field_2) {
    operator_delete(local_50.m_staFile._M_dataplus._M_p,
                    local_50.m_staFile.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

void GrcSymbolTableEntry::CreateFeatAltIDSymbol(GrcSymbolTable * psymtbl, GdlFeatureDefn * pfeat,
	GdlStringExpression * pexpString)
{
	std::string staValue = pexpString->StringValue();
	GrpLineAndFile lnf = pexpString->LineAndFile();
	std::string staNewSymbol;
	staNewSymbol.append(pfeat->Name());
	staNewSymbol.append("__");
	staNewSymbol.append(staValue);
	psymtbl->AddFeatureAltSymbol(pfeat, staNewSymbol, lnf);
}